

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_resolve(char *host,char *buf,size_t n)

{
  size_t __maxlen;
  int iVar1;
  char *pcVar2;
  int local_28;
  in_addr local_24;
  size_t sStack_20;
  in_addr ad;
  size_t n_local;
  char *buf_local;
  char *host_local;
  
  sStack_20 = n;
  iVar1 = mg_resolve2(host,(in_addr *)&local_24);
  __maxlen = sStack_20;
  if (iVar1 == 0) {
    local_28 = 0;
  }
  else {
    pcVar2 = inet_ntoa(local_24);
    local_28 = snprintf(buf,__maxlen,"%s",pcVar2);
  }
  return local_28;
}

Assistant:

int mg_resolve(const char *host, char *buf, size_t n) {
    struct in_addr ad;
    return mg_resolve2(host, &ad) ? snprintf(buf, n, "%s", inet_ntoa(ad)) : 0;
}